

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

pair<signed_char,_short> __thiscall node::getFromSrc(node *this,string *src)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  arrowType *paVar8;
  uint uVar9;
  bool bVar10;
  
  lVar4 = std::__cxx11::string::find_first_not_of((char *)src,0x1101c4,0);
  if (lVar4 == -1) {
    uVar3 = atoi((src->_M_dataplus)._M_p);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)src);
    if (iVar1 == 0) {
      uVar3 = 3;
      iVar1 = 0x40000000;
      do {
        if (uVar3 == 7) {
          uVar9 = 0;
          goto LAB_0010c6d7;
        }
        uVar5 = (iVar1 >> 0x1f) + (uVar3 & 3);
        uVar9 = -uVar5;
        if (0 < (int)uVar5) {
          uVar9 = uVar5;
        }
        iVar2 = (*this->arrows[uVar9]->_vptr_arrowType[1])
                          (this->arrows[uVar9],(ulong)(uint)(int)(char)this->nodeId);
        uVar3 = uVar3 + 1;
        iVar1 = iVar1 + 0x40000000;
      } while ((char)iVar2 == '\0');
      uVar3 = (*this->arrows[uVar9]->_vptr_arrowType[2])
                        (this->arrows[uVar9],(ulong)(uint)(int)(char)this->nodeId);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)src);
      if (iVar1 == 0) {
        switch(this->last) {
        case '\0':
          pcVar7 = (char *)src->_M_string_length;
          pcVar6 = "UP";
          break;
        case '\x01':
          pcVar7 = (char *)src->_M_string_length;
          pcVar6 = "RIGHT";
          break;
        case '\x02':
          pcVar7 = (char *)src->_M_string_length;
          pcVar6 = "DOWN";
          break;
        case '\x03':
          pcVar7 = (char *)src->_M_string_length;
          pcVar6 = "LEFT";
          break;
        default:
          goto switchD_0010c587_caseD_4;
        case '\x05':
          uVar3 = 0;
          goto LAB_0010c6c9;
        }
        std::__cxx11::string::_M_replace((ulong)src,0,pcVar7,(ulong)pcVar6);
      }
switchD_0010c587_caseD_4:
      iVar1 = std::__cxx11::string::compare((char *)src);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)src);
        if (iVar1 == 0) {
          uVar9 = 1;
LAB_0010c6d7:
          uVar3 = 0;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)src);
          if (iVar1 == 0) {
            paVar8 = this->arrows[3];
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)src);
            if (iVar1 == 0) {
              paVar8 = this->arrows[1];
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)src);
              if (iVar1 == 0) {
                paVar8 = this->arrows[0];
              }
              else {
                std::__cxx11::string::compare((char *)src);
                paVar8 = this->arrows[2];
              }
            }
          }
          iVar1 = (*paVar8->_vptr_arrowType[1])(paVar8,(ulong)(uint)(int)(char)this->nodeId);
          uVar3 = 0;
          bVar10 = (char)iVar1 != '\0';
          if (bVar10) {
            uVar3 = (*paVar8->_vptr_arrowType[2])(paVar8,(ulong)(uint)(int)(char)this->nodeId);
          }
          uVar9 = (uint)bVar10;
          (*paVar8->_vptr_arrowType[5])(paVar8);
        }
        goto LAB_0010c72d;
      }
      uVar3 = (uint)(ushort)this->acc;
    }
  }
LAB_0010c6c9:
  uVar9 = 1;
LAB_0010c72d:
  return (pair<signed_char,_short>)(uVar3 << 0x10 | uVar9);
}

Assistant:

pair<int8_t, int16_t> node::getFromSrc(string src) {
  if(src.find_first_not_of("0123456789") == std::string::npos) {
    // Then src is just a number
    pair<bool, int16_t> p;
    p.first = READY;
    try{
      p.second = atoi(src.c_str());
    }
    catch(...){
      p.first = INVALID;
      return p;
    }
    return p;
  } else {
    if(src=="ANY"){
      pair<bool, int16_t> p;
      for(int i=0;i<4;i++){
	int num=abs((i+3)%4-(int)floor((i+1)/2)%2);            //Ask Tyler
	if (arrows[num]->getRequest(nodeId)){
	  p.first = true;
	  p.second = arrows[num]->nodeGet(nodeId);
	  return p;
	}
      }
      p.first=false;
      return p;
    }
    if(src=="LAST"){
      if(last==5){
	pair<bool, int16_t> p;
	p.first=true;
	p.second=0;
	return p;
      }
      else{
	if(last==0)
	  src="UP";
	else if(last==1)
	  src="RIGHT";
	else if(last==2)
	  src="DOWN";
	else if(last==3)
	  src="LEFT";
      }
    }
    if(src == "ACC") {
      pair<bool, int16_t> p;
      p.first = true;
      p.second = this->acc;
      return p;
    } else if (src ==  "NIL") {
      pair<bool, int16_t> p;
      p.first = true;
      p.second = 0;
      return p;
    } else if (src ==  "LEFT") {
      arrowType *a = arrows[3];
      pair<bool, int16_t> p;

      if (a->getRequest(nodeId)) {
        p.first = true;
        p.second = a->nodeGet(nodeId);
      } else {
        p.first = false;
      }
      a->updateValues();
      return p;
    } else if (src ==  "RIGHT") {
    	arrowType *a = arrows[1];
      pair<bool, int16_t> p;

      if (a->getRequest(nodeId)) {
        p.first = true;
        p.second = a->nodeGet(nodeId);
      } else {
        p.first = false;
      }
      a->updateValues();
      return p;
    } else if (src ==  "UP") {
    	arrowType *a = arrows[0];
	pair<bool, int16_t> p;

      if (a->getRequest(nodeId)){
        p.first = true;
        p.second = a->nodeGet(nodeId);
      } else {
        p.first = false;
      }
      a->updateValues();
      return p;
    } else if (src ==  "DOWN") {
    	arrowType *a = arrows[2];
      pair<bool, int16_t> p;

      if (a->getRequest(nodeId)) {
        p.first = true;
        p.second = a->nodeGet(nodeId);
      } else {
        p.first = false;
      }
      a->updateValues();
      return p;
    }
  }
  // ANY and LAST are for the future (hopefully not)
}